

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign.h
# Opt level: O3

void dlib::blas_bindings::
     matrix_assign_blas<float,dlib::matrix_add_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_trans<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>>>>
               (assignable_ptr_matrix<float> *dest,
               matrix_add_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>_>
               *src)

{
  matrix_op<dlib::op_pointer_to_mat<float>_> *pmVar1;
  long lVar2;
  bool bVar3;
  float *pfVar4;
  float *pfVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout> temp;
  undefined1 local_30 [16];
  long lStack_20;
  other local_18;
  
  local_30._0_8_ = dest->ptr;
  local_30._8_8_ = dest->height;
  lStack_20 = dest->width;
  local_18._vptr_memory_manager_stateless_kernel_1 = (_func_int **)vpextrq_avx(unique0x00006c80,1);
  bVar3 = matrix_add_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_trans<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>>>
          ::aliases<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>
                    ((matrix_add_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_trans<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>>>
                      *)src,(matrix_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_> *)
                            local_30);
  if (bVar3) {
    matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>::
    matrix((matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
            *)local_30,dest->height,dest->width);
    pmVar1 = src->lhs;
    lVar2 = (pmVar1->op).rows;
    if (0 < lVar2) {
      pfVar4 = (pmVar1->op).ptr;
      lVar7 = (pmVar1->op).cols;
      lVar9 = (pmVar1->op).stride;
      lVar6 = 0;
      pfVar5 = (float *)local_30._0_8_;
      do {
        if (0 < lVar7) {
          lVar8 = 0;
          do {
            pfVar5[lVar8] = pfVar4[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar7 != lVar8);
        }
        lVar6 = lVar6 + 1;
        pfVar5 = pfVar5 + lStack_20;
        pfVar4 = pfVar4 + lVar9;
      } while (lVar6 != lVar2);
    }
    default_matrix_multiply<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_trans<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>>
              ((matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                *)local_30,src->rhs->lhs,src->rhs->rhs);
    if (0 < (long)local_30._8_8_) {
      lVar2 = dest->width;
      pfVar4 = dest->ptr;
      lVar7 = 0;
      pfVar5 = (float *)local_30._0_8_;
      do {
        if (0 < lStack_20) {
          lVar9 = 0;
          do {
            pfVar4[lVar9] = pfVar5[lVar9];
            lVar9 = lVar9 + 1;
          } while (lStack_20 != lVar9);
        }
        lVar7 = lVar7 + 1;
        pfVar4 = pfVar4 + lVar2;
        pfVar5 = pfVar5 + lStack_20;
      } while (lVar7 != local_30._8_8_);
    }
    if ((float *)local_30._0_8_ != (float *)0x0) {
      operator_delete__((void *)local_30._0_8_);
    }
  }
  else {
    pmVar1 = src->lhs;
    lVar2 = (pmVar1->op).rows;
    if (0 < lVar2) {
      lVar7 = dest->width;
      pfVar4 = (pmVar1->op).ptr;
      lVar9 = (pmVar1->op).cols;
      lVar6 = (pmVar1->op).stride;
      pfVar5 = dest->ptr;
      lVar8 = 0;
      do {
        if (0 < lVar9) {
          lVar10 = 0;
          do {
            pfVar5[lVar10] = pfVar4[lVar10];
            lVar10 = lVar10 + 1;
          } while (lVar9 != lVar10);
        }
        lVar8 = lVar8 + 1;
        pfVar5 = pfVar5 + lVar7;
        pfVar4 = pfVar4 + lVar6;
      } while (lVar8 != lVar2);
    }
    default_matrix_multiply<dlib::assignable_ptr_matrix<float>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_trans<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>>
              (dest,src->rhs->lhs,src->rhs->rhs);
  }
  return;
}

Assistant:

void matrix_assign_blas (
            assignable_ptr_matrix<T>& dest,
            const src_exp& src
        )
        {
            if (src.aliases(mat(dest.ptr,dest.height,dest.width)))
            {
                matrix<T> temp(dest.nr(),dest.nc());
                matrix_assign_blas_proxy(temp,src,1,false, false);
                matrix_assign_default(dest,temp);
            }
            else
            {
                matrix_assign_blas_proxy(dest,src,1,false, false);
            }
        }